

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::IfExpr::~IfExpr(IfExpr *this)

{
  Expr *pEVar1;
  pointer pTVar2;
  pointer pcVar3;
  _func_int ***ppp_Var4;
  
  (this->super_ExprMixin<(wabt::ExprType)21>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExpr_001c7d58;
  pEVar1 = (this->false_).first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var4 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var4)[1])();
  }
  (this->false_).first_ = (Expr *)0x0;
  (this->false_).last_ = (Expr *)0x0;
  (this->false_).size_ = 0;
  pEVar1 = (this->true_).exprs.first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var4 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var4)[1])();
  }
  (this->true_).exprs.first_ = (Expr *)0x0;
  (this->true_).exprs.last_ = (Expr *)0x0;
  (this->true_).exprs.size_ = 0;
  pTVar2 = (this->true_).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2);
  }
  pTVar2 = (this->true_).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2);
  }
  Var::~Var(&(this->true_).decl.type_var);
  pcVar3 = (this->true_).label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->true_).label.field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit IfExpr(const Location& loc = Location())
      : ExprMixin<ExprType::If>(loc) {}